

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q.cpp
# Opt level: O3

void __thiscall Q::create(Q *this,string *name,string *location)

{
  pointer pbVar1;
  bool bVar2;
  pointer dir_00;
  Directory base;
  Directory dir;
  File FStack_d8;
  File local_80;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->_location);
  Directory::Directory((Directory *)&FStack_d8,&this->_location);
  bVar2 = Path::exists(&FStack_d8.super_Path);
  if (!bVar2) {
    Directory::create((Directory *)&FStack_d8,0x1c0);
  }
  pbVar1 = structure_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (structure_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      structure_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    dir_00 = structure_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      Directory::Directory((Directory *)&local_80,(Directory *)&FStack_d8);
      Path::operator+=(&local_80.super_Path,dir_00);
      bVar2 = Path::exists(&local_80.super_Path);
      if (!bVar2) {
        Directory::create((Directory *)&local_80,0x1c0);
      }
      File::~File(&local_80);
      dir_00 = dir_00 + 1;
    } while (dir_00 != pbVar1);
  }
  File::~File(&FStack_d8);
  return;
}

Assistant:

void Q::create (const std::string& name, const std::string& location)
{
  _name = name;
  _location = location;

  Directory base (_location);
  if (! base.exists ())
    base.create (0700);

  for (const auto& item : structure)
  {
    Directory dir {base};
    dir += item;
    if (! dir.exists ())
      dir.create (0700);
  }
}